

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs.h
# Opt level: O3

void __thiscall merlin::gibbs::gibbs(gibbs *this,graphical_model *fg)

{
  string local_50;
  
  graphical_model::graphical_model(&this->super_graphical_model,fg);
  (this->super_algorithm).m_stop_msg = 0.0;
  (this->super_algorithm).m_start_time = 0.0;
  (this->super_algorithm).m_stop_iter = 0.0;
  (this->super_algorithm).m_stop_obj = 0.0;
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__gibbs_00190c40;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&PTR__gibbs_00190cd8;
  (this->m_task).t_ = PR;
  (this->m_state).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_state).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_state).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_best_config).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_best_config).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_best_config).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_samples).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_samples).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_samples).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  set_properties(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

gibbs(const graphical_model& fg) :
			graphical_model(fg) {
		set_properties();
	}